

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O0

_Bool update_size(lzma_vli *size,lzma_vli add,lzma_vli limit)

{
  undefined8 local_28;
  lzma_vli limit_local;
  lzma_vli add_local;
  lzma_vli *size_local;
  
  local_28 = limit;
  if (0x7fffffffffffffff < limit) {
    local_28 = 0x7fffffffffffffff;
  }
  if ((local_28 < *size) || (local_28 - *size < add)) {
    size_local._7_1_ = true;
  }
  else {
    *size = add + *size;
    size_local._7_1_ = false;
  }
  return size_local._7_1_;
}

Assistant:

static inline bool
update_size(lzma_vli *size, lzma_vli add, lzma_vli limit)
{
	if (limit > LZMA_VLI_MAX)
		limit = LZMA_VLI_MAX;

	if (limit < *size || limit - *size < add)
		return true;

	*size += add;

	return false;
}